

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

EndpointObject * anon_unknown.dwarf_784a3::verifyEndpoint(HelicsEndpoint ept,HelicsError *err)

{
  HelicsError *in_RSI;
  EndpointObject *in_RDI;
  EndpointObject *endObj;
  EndpointObject *local_8;
  
  if ((in_RSI == (HelicsError *)0x0) || (in_RSI->error_code == 0)) {
    if ((in_RDI == (EndpointObject *)0x0) || (local_8 = in_RDI, in_RDI->valid != -0x4bac6b3e)) {
      assignError(in_RSI,-3,"The given endpoint does not point to a valid object");
      local_8 = (EndpointObject *)0x0;
    }
  }
  else {
    local_8 = (EndpointObject *)0x0;
  }
  return local_8;
}

Assistant:

helics::EndpointObject* verifyEndpoint(HelicsEndpoint ept, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    auto* endObj = reinterpret_cast<helics::EndpointObject*>(ept);
    if (endObj == nullptr || endObj->valid != EndpointValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidEndpoint);
        return nullptr;
    }
    return endObj;
}